

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O0

cmListFileLexer_Token * cmListFileLexer_Scan(cmListFileLexer *lexer)

{
  int iVar1;
  cmListFileLexer *lexer_local;
  
  if ((lexer->file == (FILE *)0x0) && (lexer->string_buffer == (char *)0x0)) {
    lexer_local = (cmListFileLexer *)0x0;
  }
  else {
    iVar1 = cmListFileLexer_yylex(lexer->scanner,lexer);
    lexer_local = lexer;
    if (iVar1 == 0) {
      cmListFileLexer_SetFileName(lexer,(char *)0x0,(cmListFileLexer_BOM *)0x0);
      lexer_local = (cmListFileLexer *)0x0;
    }
  }
  return &lexer_local->token;
}

Assistant:

cmListFileLexer_Token* cmListFileLexer_Scan(cmListFileLexer* lexer)
{
  if (!lexer->file && !lexer->string_buffer) {
    return 0;
  }
  if (cmListFileLexer_yylex(lexer->scanner, lexer)) {
    return &lexer->token;
  } else {
    cmListFileLexer_SetFileName(lexer, 0, 0);
    return 0;
  }
}